

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

CPubKey * AddrToPubKey(CPubKey *__return_storage_ptr__,FillableSigningProvider *keystore,
                      string *addr_in)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  UniValue *pUVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  CKeyID key;
  CTxDestination dest;
  CKeyID local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_80;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  DecodeDestination((CTxDestination *)&local_80,addr_in);
  bVar1 = IsValidDestination((CTxDestination *)&local_80);
  if (bVar1) {
    GetKeyForDestination(&local_b4,&keystore->super_SigningProvider,(CTxDestination *)&local_80);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<160u>::IsNull()const::_lambda(unsigned_char)_1_>>
                       (&local_b4,&local_a0);
    if (pbVar3 == &local_a0) {
      pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<std::__cxx11::string>
                (&local_a0,(tinyformat *)"\'%s\' does not refer to a key",(char *)addr_in,in_RCX);
      JSONRPCError(pUVar4,-5,&local_a0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      __return_storage_ptr__->vch[0] = 0xff;
      iVar2 = (*(keystore->super_SigningProvider)._vptr_SigningProvider[4])
                        (keystore,&local_b4,__return_storage_ptr__);
      if ((char)iVar2 == '\0') {
        pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
        tinyformat::format<std::__cxx11::string>
                  (&local_a0,(tinyformat *)"no full public key for address %s",(char *)addr_in,
                   in_RCX);
        JSONRPCError(pUVar4,-5,&local_a0);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
      else {
        bVar1 = CPubKey::IsFullyValid(__return_storage_ptr__);
        if (bVar1) {
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage(&local_80);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            return __return_storage_ptr__;
          }
        }
        else {
          pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"Wallet contains an invalid public key","");
          JSONRPCError(pUVar4,-0x7f5b,&local_a0);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
          }
        }
      }
    }
  }
  else {
    pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
    std::operator+(&local_a0,"Invalid address: ",addr_in);
    JSONRPCError(pUVar4,-5,&local_a0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

CPubKey AddrToPubKey(const FillableSigningProvider& keystore, const std::string& addr_in)
{
    CTxDestination dest = DecodeDestination(addr_in);
    if (!IsValidDestination(dest)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid address: " + addr_in);
    }
    CKeyID key = GetKeyForDestination(keystore, dest);
    if (key.IsNull()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("'%s' does not refer to a key", addr_in));
    }
    CPubKey vchPubKey;
    if (!keystore.GetPubKey(key, vchPubKey)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("no full public key for address %s", addr_in));
    }
    if (!vchPubKey.IsFullyValid()) {
       throw JSONRPCError(RPC_INTERNAL_ERROR, "Wallet contains an invalid public key");
    }
    return vchPubKey;
}